

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::evalTexelFetch3D(ShaderEvalContext *c,TexLookupParams *p)

{
  undefined1 local_50 [32];
  void *local_30;
  undefined8 uStack_28;
  
  tcu::ConstPixelBufferAccess::getPixel
            ((ConstPixelBufferAccess *)local_50,
             (int)c->in[1].m_data[0] * 0x28 +
             (int)((c->textures[0].tex3D)->super_TextureLevelPyramid).m_access.
                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_start,
             (int)c->in[0].m_data[0] + (p->offset).m_data[0],
             (int)c->in[0].m_data[1] + (p->offset).m_data[1]);
  tcu::operator*((tcu *)(local_50 + 0x10),(Vector<float,_4> *)local_50,&p->scale);
  tcu::operator+((tcu *)&local_30,(Vector<float,_4> *)(local_50 + 0x10),&p->bias);
  *(void **)(c->color).m_data = local_30;
  *(undefined8 *)((c->color).m_data + 2) = uStack_28;
  return;
}

Assistant:

static void evalTexelFetch3D (ShaderEvalContext& c, const TexLookupParams& p)
{
	int	x	= deChopFloatToInt32(c.in[0].x())+p.offset.x();
	int	y	= deChopFloatToInt32(c.in[0].y())+p.offset.y();
	int	z	= deChopFloatToInt32(c.in[0].z())+p.offset.z();
	int	lod = deChopFloatToInt32(c.in[1].x());
	c.color = c.textures[0].tex3D->getLevel(lod).getPixel(x, y, z)*p.scale + p.bias;
}